

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O0

void __thiscall
amrex::DeriveList::add
          (DeriveList *this,string *name,IndexType result_type,int nvar_der,
          DeriveFuncFab *der_func_fab,DeriveBoxMap bx_map,Interpolater *interp)

{
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  *in_RSI;
  value_type *in_RDI;
  DeriveRec *this_00;
  DeriveBoxMap in_stack_fffffffffffffef8;
  DeriveFuncFab *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  string *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff24;
  pointer in_stack_ffffffffffffff30;
  
  this_00 = (DeriveRec *)&stack0xffffffffffffff08;
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  ::function(in_RSI,(function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                     *)in_RDI);
  DeriveRec::DeriveRec
            ((DeriveRec *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (IndexType)in_stack_ffffffffffffff24,in_stack_ffffffffffffff0c,
             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (Interpolater *)in_stack_ffffffffffffff30);
  std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::push_back
            ((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)in_RSI,in_RDI);
  DeriveRec::~DeriveRec(this_00);
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  ::~function((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
               *)0x1113132);
  return;
}

Assistant:

void
DeriveList::add (const std::string&      name,
                 IndexType               result_type,
                 int                     nvar_der,
                 DeriveFuncFab           der_func_fab,
                 DeriveRec::DeriveBoxMap bx_map,
                 Interpolater*           interp)
{
    lst.push_back(DeriveRec(name,result_type,nvar_der,der_func_fab,bx_map,interp));
}